

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.h
# Opt level: O3

void __thiscall chain_of_responsibility::IWorker::IWorker(IWorker *this)

{
  this->_vptr_IWorker = (_func_int **)&PTR___cxa_pure_virtual_00129a78;
  (this->next_worker_).
  super___shared_ptr<chain_of_responsibility::IWorker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->next_worker_).
  super___shared_ptr<chain_of_responsibility::IWorker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IWorker::IWorker(/* args */) {}